

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::evalSubscriptMat4x2(ShaderEvalContext *c)

{
  int i;
  long lVar1;
  Vector<float,_2> res_4;
  Vector<float,_2> res_2;
  Vector<float,_2> res;
  Vector<float,_2> res_1;
  Vector<float,_2> res_3;
  Vector<float,_2> res_5;
  float local_30 [4];
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  int local_8 [2];
  
  local_18 = (c->coords).m_data[0];
  local_14 = (c->coords).m_data[1];
  local_1c = (c->coords).m_data[2];
  local_20 = local_14;
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] = local_30[lVar1 + 4] * 0.5;
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_1.m_data[lVar1] = local_30[lVar1 + 6] + res.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_30[3] = (c->coords).m_data[3];
  local_30[2] = local_1c;
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_2.m_data[lVar1] = local_30[lVar1 + 2] * 0.25;
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_3.m_data[lVar1] = res_1.m_data[lVar1] + res_2.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_30[0] = local_30[3];
  local_30[1] = local_18;
  res_4.m_data[0] = 0.0;
  res_4.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_4.m_data[lVar1] = local_30[lVar1] * 0.125;
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  res_5.m_data[0] = 0.0;
  res_5.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res_5.m_data[lVar1] = res_3.m_data[lVar1] + res_4.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_8[0] = 0;
  local_8[1] = 1;
  lVar1 = 0;
  do {
    (c->color).m_data[local_8[lVar1]] = res_5.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }